

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O2

err_t stb99SeedAdj(stb99_seed *seed)

{
  bool bVar1;
  bool_t bVar2;
  err_t eVar3;
  long lVar4;
  ulong uVar5;
  size_t r;
  size_t *psVar6;
  ulong uVar7;
  
  bVar2 = memIsValid(seed,0x128);
  if (bVar2 == 0) {
    eVar3 = 0x6d;
  }
  else {
    eVar3 = 0x20c;
    for (lVar4 = 0; lVar4 != 0x50; lVar4 = lVar4 + 8) {
      if (*(size_t *)((long)_ls + lVar4) == seed->l) {
        r = *(size_t *)((long)_rs + lVar4);
        eVar3 = stb99ZiVal(seed);
        if (eVar3 != 0) {
          bVar2 = memIsZero(seed->zi,0x3e);
          if (bVar2 == 0) {
            return 0x20c;
          }
          lVar4 = 0;
          while (lVar4 != 0x1f) {
            seed->zi[lVar4] = (u16)(lVar4 + 1);
            lVar4 = lVar4 + 1;
          }
        }
        eVar3 = stb99DiVal(seed,r);
        if (eVar3 != 0) {
          bVar2 = memIsZero(seed->di,0x90);
          if (bVar2 == 0) {
            return 0x20c;
          }
          uVar5 = (seed->l >> 1) + 1;
          seed->di[0] = uVar5;
          psVar6 = seed->di;
          do {
            psVar6 = psVar6 + 1;
            uVar7 = (uVar5 >> 1) + 1;
            *psVar6 = uVar7;
            bVar1 = 0x3f < uVar5;
            uVar5 = uVar7;
          } while (bVar1);
        }
        eVar3 = stb99RiVal(seed,r);
        if (eVar3 != 0) {
          bVar2 = memIsZero(seed->ri,0x50);
          if (bVar2 == 0) {
            return 0x20c;
          }
          seed->ri[0] = r;
          psVar6 = seed->ri;
          do {
            psVar6 = psVar6 + 1;
            uVar5 = (r >> 1) + 1;
            *psVar6 = uVar5;
            bVar1 = 0x3f < r;
            r = uVar5;
          } while (bVar1);
        }
        return 0;
      }
    }
  }
  return eVar3;
}

Assistant:

err_t stb99SeedAdj(stb99_seed* seed)
{
	size_t i;
	size_t r;
	// проверить указатели
	if (!memIsValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// проверить l
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == seed->l)
			break;
	if (i == COUNT_OF(_ls))
		return ERR_BAD_SEED;
	// определить r = r(l)
	r = _rs[i];
	// проверить zi
	if (stb99ZiVal(seed) != ERR_OK)
	{
		if (!memIsZero(seed->zi, sizeof(seed->zi)))
			return ERR_BAD_SEED;
		for (i = 0; i < 31; ++i)
			seed->zi[i] = (u16)(i + 1);
	}
	// проверить цепочку di
	if (stb99DiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->di, sizeof(seed->di)))
			return ERR_BAD_SEED;
		seed->di[0] = seed->l / 2 + 1;
		for (i = 1; (seed->di[i] = seed->di[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->di[i] > 16);
	}
	// проверить цепочку ri
	if (stb99RiVal(seed, r) != ERR_OK)
	{
		if (!memIsZero(seed->ri, sizeof(seed->ri)))
			return ERR_BAD_SEED;
		seed->ri[0] = r;
		for (i = 1; (seed->ri[i] = seed->ri[i - 1] / 2 + 1) > 32; ++i);
		ASSERT(seed->ri[i] > 16);
	}
	return ERR_OK;
}